

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O0

void __thiscall SatPos::CalculateEk(SatPos *this,double Mk,double ecc,double *Ek)

{
  int __x;
  double dVar1;
  double extraout_XMM0_Qa;
  double error;
  double dStack_30;
  int count;
  double Ek0;
  double *Ek_local;
  double ecc_local;
  double Mk_local;
  SatPos *this_local;
  
  __x = (int)this;
  dStack_30 = 1.0;
  error._4_4_ = 0;
  while( true ) {
    if (10 < error._4_4_) {
      return;
    }
    dVar1 = sin(dStack_30);
    *Ek = ecc * dVar1 + Mk;
    std::abs(__x);
    if (extraout_XMM0_Qa < 1e-07) break;
    dStack_30 = *Ek;
    error._4_4_ = error._4_4_ + 1;
  }
  return;
}

Assistant:

void SatPos::CalculateEk(const double Mk, const double ecc, double &Ek)
{
    double Ek0 = 1;
    int count = 0;
    while (count <= 10)
    {
        Ek = Mk + ecc * sin(Ek0);
        double error = abs(Ek - Ek0);
        if(error < 1e-7)
            break;
        Ek0 = Ek;
        count ++;
    }
}